

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O3

IceTInt icetTypeWidth(IceTEnum type)

{
  switch(type) {
  case 0x8000:
  case 0x8001:
  case 0x800f:
    return 1;
  case 0x8002:
    return 2;
  case 0x8003:
  case 0x8004:
    return 4;
  case 0x8005:
  case 0x8008:
    return 8;
  case 0x8006:
  case 0x8007:
  case 0x8009:
  case 0x800a:
  case 0x800b:
  case 0x800c:
  case 0x800d:
  case 0x800e:
    goto switchD_0010990a_caseD_8006;
  default:
    if (type == 0) {
      return 0;
    }
switchD_0010990a_caseD_8006:
    icetRaiseDiagnostic("Bad type identifier.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/porting.c"
                        ,0x4f);
    return 0;
  }
}

Assistant:

IceTInt icetTypeWidth(IceTEnum type)
{
    switch (type) {
      case ICET_BOOLEAN:
          return sizeof(IceTBoolean);
      case ICET_BYTE:
          return sizeof(IceTByte);
      case ICET_SHORT:
          return sizeof(IceTShort);
      case ICET_INT:
          return sizeof(IceTInt);
      case ICET_FLOAT:
          return sizeof(IceTFloat);
      case ICET_DOUBLE:
          return sizeof(IceTDouble);
      case ICET_POINTER:
          return sizeof(IceTVoid *);
      case ICET_VOID:
          return 1;
      case ICET_NULL:
          return 0;
      default:
          icetRaiseError("Bad type identifier.", ICET_INVALID_VALUE);
    }

    return 0;
}